

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O1

void __thiscall
amrex::ForkJoin::ForkJoin(ForkJoin *this,Vector<double,_std::allocator<double>_> *task_rank_pct)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  size_type sVar3;
  size_type __n;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Vector<int,_std::allocator<int>_> task_rank_n;
  allocator_type local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  double local_58;
  vector<int,_std::allocator<int>_> local_50;
  double local_38;
  
  this->flag_verbose = false;
  this->flag_invoked = false;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->split_bounds).super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  this->task_me = -1;
  p_Var1 = &(this->dms)._M_t._M_impl.super__Rb_tree_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->data)._M_h._M_buckets = &(this->data)._M_h._M_single_bucket;
  (this->data)._M_h._M_bucket_count = 1;
  (this->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data)._M_h._M_element_count = 0;
  (this->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60 = &(this->task_output_dir).field_2;
  (this->task_output_dir)._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->task_output_dir,"");
  iVar4 = *(int *)(DAT_00842950 + -0x38);
  __n = (long)(task_rank_pct->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(task_rank_pct->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__n,&local_61);
  if (0 < (long)__n) {
    local_38 = (double)iVar4;
    sVar3 = 0;
    uVar5 = 0;
    uVar6 = 0;
    iVar4 = 0;
    do {
      local_58 = (double)CONCAT44(uVar6,uVar5) +
                 (task_rank_pct->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[sVar3];
      lVar2 = lround(local_58 * local_38);
      uVar5 = SUB84(local_58,0);
      uVar6 = (undefined4)((ulong)local_58 >> 0x20);
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar3] = (int)lVar2 - iVar4;
      sVar3 = sVar3 + 1;
      iVar4 = (int)lVar2;
    } while (__n != sVar3);
  }
  init(this,(EVP_PKEY_CTX *)&local_50);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ForkJoin::ForkJoin (const Vector<double> &task_rank_pct)
{
    auto rank_n = ParallelContext::NProcsSub(); // number of ranks in current frame
    auto ntasks = task_rank_pct.size();
    Vector<int> task_rank_n(ntasks);
    int prev = 0;
    double accum = 0;
    for (int i = 0; i < ntasks; ++i) {
        accum += task_rank_pct[i];
        int cur = std::lround(rank_n * accum);
        task_rank_n[i] = cur - prev;
        prev = cur;
    }

    init(task_rank_n);
}